

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AddUtility(cmTarget *this,string *name,bool cross,cmMakefile *mf)

{
  pointer pcVar1;
  bool bVar2;
  undefined1 local_98 [56];
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_60;
  cmMakefile *local_28;
  cmMakefile *mf_local;
  string *psStack_18;
  bool cross_local;
  string *name_local;
  cmTarget *this_local;
  
  local_28 = mf;
  mf_local._7_1_ = cross;
  psStack_18 = name;
  name_local = (string *)this;
  pcVar1 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<bool_&,_true>((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                      *)(local_98 + 0x10),psStack_18,(bool *)((long)&mf_local + 7));
  bVar2 = local_28 == (cmMakefile *)0x0;
  if (bVar2) {
    local_98._0_8_ = (element_type *)0x0;
    local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_98);
  }
  else {
    cmMakefile::GetBacktrace((cmMakefile *)local_98);
  }
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::BT(&local_60,
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
        *)(local_98 + 0x10),(cmListFileBacktrace *)local_98);
  std::
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  ::insert(&pcVar1->Utilities,&local_60);
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::~BT(&local_60);
  if (bVar2) {
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_98);
  }
  else {
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_98);
  }
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
         *)(local_98 + 0x10));
  return;
}

Assistant:

void cmTarget::AddUtility(std::string const& name, bool cross, cmMakefile* mf)
{
  this->impl->Utilities.insert(BT<std::pair<std::string, bool>>(
    { name, cross }, mf ? mf->GetBacktrace() : cmListFileBacktrace()));
}